

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

double __thiscall
HighsLpRelaxation::computeLPDegneracy(HighsLpRelaxation *this,HighsDomain *localdomain)

{
  double dVar1;
  double dVar2;
  HighsInt HVar3;
  HighsInt HVar4;
  int iVar5;
  HighsSolution *pHVar6;
  HighsBasis *pHVar7;
  HighsInfo *pHVar8;
  HighsLp *pHVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  long in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *pvVar12;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double fac2;
  double fac1;
  double varConsRatio;
  double degenerateColumnShare;
  HighsInt base;
  HighsInt i_1;
  HighsInt numFixedCols;
  HighsInt numAlreadyFixedCols;
  HighsInt i;
  HighsInt numBasicEqualities;
  HighsInt numInequalities;
  HighsInt numFixedRows;
  HighsSolution *sol;
  HighsBasis *basis;
  double dualFeasTol;
  double local_c8;
  double local_c0;
  double local_b0;
  double local_a8;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  double local_8;
  
  pHVar6 = Highs::getSolution((Highs *)(in_RDI + 8));
  if (((pHVar6->dual_valid & 1U) == 0) ||
     (pHVar7 = Highs::getBasis((Highs *)(in_RDI + 8)), (pHVar7->valid & 1U) == 0)) {
    local_8 = 1.0;
  }
  else {
    pHVar8 = Highs::getInfo((Highs *)(in_RDI + 8));
    dVar1 = (pHVar8->super_HighsInfoStruct).max_dual_infeasibility;
    pHVar7 = Highs::getBasis((Highs *)(in_RDI + 8));
    pHVar6 = Highs::getSolution((Highs *)(in_RDI + 8));
    local_34 = 0;
    local_38 = 0;
    local_3c = 0;
    for (local_40 = 0; HVar3 = numRows((HighsLpRelaxation *)0x605865), local_40 < HVar3;
        local_40 = local_40 + 1) {
      pHVar9 = Highs::getLp((Highs *)(in_RDI + 8));
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&pHVar9->row_lower_,(long)local_40);
      dVar2 = *pvVar10;
      pHVar9 = Highs::getLp((Highs *)(in_RDI + 8));
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&pHVar9->row_upper_,(long)local_40);
      if ((dVar2 != *pvVar10) || (NAN(dVar2) || NAN(*pvVar10))) {
        local_38 = local_38 + 1;
        pvVar11 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                            (&pHVar7->row_status,(long)local_40);
        if (*pvVar11 != kBasic) {
          pvVar12 = &pHVar6->row_dual;
          std::vector<double,_std::allocator<double>_>::operator[](pvVar12,(long)local_40);
          std::abs((int)pvVar12);
          if (dVar1 < extraout_XMM0_Qa) {
            local_34 = local_34 + 1;
          }
        }
      }
      else {
        pvVar11 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                            (&pHVar7->row_status,(long)local_40);
        local_3c = (uint)(*pvVar11 == kBasic) + local_3c;
      }
    }
    local_44 = 0;
    local_48 = 0;
    for (local_4c = 0; HVar3 = numCols((HighsLpRelaxation *)0x6059bc), local_4c < HVar3;
        local_4c = local_4c + 1) {
      pvVar11 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                          (&pHVar7->col_status,(long)local_4c);
      if (*pvVar11 != kBasic) {
        pvVar12 = &pHVar6->col_dual;
        std::vector<double,_std::allocator<double>_>::operator[](pvVar12,(long)local_4c);
        std::abs((int)pvVar12);
        if (extraout_XMM0_Qa_00 <= dVar1) {
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x308),
                               (long)local_4c);
          dVar2 = *pvVar10;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RSI + 800),
                               (long)local_4c);
          if ((dVar2 == *pvVar10) && (!NAN(dVar2) && !NAN(*pvVar10))) {
            local_44 = local_44 + 1;
          }
        }
        else {
          local_48 = local_48 + 1;
        }
      }
    }
    HVar3 = numCols((HighsLpRelaxation *)0x605aa1);
    HVar4 = numRows((HighsLpRelaxation *)0x605ac4);
    iVar5 = ((HVar3 - local_44) + local_38 + local_3c) - HVar4;
    if (iVar5 < 1) {
      local_a8 = 0.0;
    }
    else {
      local_a8 = 1.0 - (double)(local_48 + local_34) / (double)iVar5;
    }
    HVar3 = numRows((HighsLpRelaxation *)0x605b28);
    if (HVar3 < 1) {
      local_b0 = 1.0;
    }
    else {
      HVar3 = numCols((HighsLpRelaxation *)0x605b37);
      HVar4 = numRows((HighsLpRelaxation *)0x605b6e);
      local_b0 = (double)((((HVar3 + local_38 + local_3c) - local_48) - local_34) - local_44) /
                 (double)HVar4;
    }
    if (0.8 <= local_a8) {
      local_c0 = pow(10.0,(local_a8 - 0.7) * 10.0);
    }
    else {
      local_c0 = 1.0;
    }
    if (2.0 <= local_b0) {
      local_c8 = local_b0 * 10.0;
    }
    else {
      local_c8 = 1.0;
    }
    local_8 = local_c0 * local_c8;
  }
  return local_8;
}

Assistant:

double HighsLpRelaxation::computeLPDegneracy(
    const HighsDomain& localdomain) const {
  if (!lpsolver.getSolution().dual_valid || !lpsolver.getBasis().valid) {
    return 1.0;
  }

  double dualFeasTol = lpsolver.getInfo().max_dual_infeasibility;

  const HighsBasis& basis = lpsolver.getBasis();
  const HighsSolution& sol = lpsolver.getSolution();

  HighsInt numFixedRows = 0;
  HighsInt numInequalities = 0;
  HighsInt numBasicEqualities = 0;

  for (HighsInt i = 0; i < numRows(); ++i) {
    if (lpsolver.getLp().row_lower_[i] != lpsolver.getLp().row_upper_[i]) {
      ++numInequalities;

      if (basis.row_status[i] != HighsBasisStatus::kBasic) {
        if (std::abs(sol.row_dual[i]) > dualFeasTol) ++numFixedRows;
      }
    } else
      numBasicEqualities += basis.row_status[i] == HighsBasisStatus::kBasic;
  }

  HighsInt numAlreadyFixedCols = 0;
  HighsInt numFixedCols = 0;
  for (HighsInt i = 0; i < numCols(); ++i) {
    if (basis.col_status[i] != HighsBasisStatus::kBasic) {
      if (std::abs(sol.col_dual[i]) > dualFeasTol)
        ++numFixedCols;
      else if (localdomain.col_lower_[i] == localdomain.col_upper_[i])
        ++numAlreadyFixedCols;
    }
  }

  HighsInt base = numCols() - numAlreadyFixedCols + numInequalities +
                  numBasicEqualities - numRows();

  double degenerateColumnShare =
      base > 0 ? 1.0 - double(numFixedCols + numFixedRows) / base : 0.0;

  double varConsRatio =
      numRows() > 0
          ? double(numCols() + numInequalities + numBasicEqualities -
                   numFixedCols - numFixedRows - numAlreadyFixedCols) /
                numRows()
          : 1.0;
  double fac1 = degenerateColumnShare < 0.8
                    ? 1.0
                    : std::pow(10.0, 10 * (degenerateColumnShare - 0.7));
  double fac2 = varConsRatio < 2.0 ? 1.0 : 10.0 * varConsRatio;

  return fac1 * fac2;
}